

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O0

void __thiscall draco::MeshEdgebreakerTraversalEncoder::Start(MeshEdgebreakerTraversalEncoder *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  long in_RDI;
  ulong uVar5;
  int i;
  RAnsBitEncoder *in_stack_ffffffffffffff88;
  RAnsBitEncoder *in_stack_ffffffffffffff90;
  ulong *local_50;
  int local_20;
  
  RAnsBitEncoder::StartEncoding((RAnsBitEncoder *)0x1971f8);
  if (0 < *(int *)(in_RDI + 0x90)) {
    uVar2 = (ulong)*(int *)(in_RDI + 0x90);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x38),0);
    uVar5 = uVar3 + 8;
    if (SUB168(auVar1 * ZEXT816(0x38),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      uVar5 = 0xffffffffffffffff;
    }
    local_50 = (ulong *)operator_new__(uVar5);
    *local_50 = uVar2;
    local_50 = local_50 + 1;
    if (uVar2 != 0) {
      puVar4 = local_50 + uVar2 * 7;
      do {
        RAnsBitEncoder::RAnsBitEncoder(in_stack_ffffffffffffff90);
        local_50 = local_50 + 7;
      } while (local_50 != puVar4);
    }
    std::unique_ptr<draco::RAnsBitEncoder[],std::default_delete<draco::RAnsBitEncoder[]>>::
    unique_ptr<draco::RAnsBitEncoder*,std::default_delete<draco::RAnsBitEncoder[]>,void,bool>
              ((unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_> *
               )in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_>::
    operator=((unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_> *)
              in_stack_ffffffffffffff90,
              (unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_> *)
              in_stack_ffffffffffffff88);
    std::unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_>::
    ~unique_ptr((unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_>
                 *)in_stack_ffffffffffffff90);
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x90); local_20 = local_20 + 1) {
      std::unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_>::
      operator[]((unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_>
                  *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
      RAnsBitEncoder::StartEncoding((RAnsBitEncoder *)0x19731a);
    }
  }
  return;
}

Assistant:

void Start() {
    start_face_encoder_.StartEncoding();
    if (num_attribute_data_ > 0) {
      // Init and start arithmetic encoders for storing configuration types
      // of non-position attributes.
      attribute_connectivity_encoders_ = std::unique_ptr<BinaryEncoder[]>(
          new BinaryEncoder[num_attribute_data_]);
      for (int i = 0; i < num_attribute_data_; ++i) {
        attribute_connectivity_encoders_[i].StartEncoding();
      }
    }
  }